

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::CompactReporter::AssertionPrinter::printReconstructedExpression(AssertionPrinter *this)

{
  ostream *poVar1;
  bool bVar2;
  Colour local_38 [8];
  Colour colour;
  
  bVar2 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar2) {
    local_38[0].m_moved = false;
    Colour::use(FileName);
    std::operator<<(this->stream," for: ");
    Colour::~Colour(local_38);
    poVar1 = this->stream;
    std::__cxx11::string::string((string *)local_38,(string *)&this->result->m_resultData);
    std::operator<<(poVar1,(string *)local_38);
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if( result.hasExpandedExpression() ) {
                    {
                        Colour colour( dimColour() );
                        stream << " for: ";
                    }
                    stream << result.getExpandedExpression();
                }
            }